

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::updateNoClear
          (CLUFactor<double> *this,int p_col,double *p_work,int *p_idx,int num)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  undefined4 *in_RDI;
  int in_R8D;
  double dVar4;
  double a;
  Real RVar5;
  double rezi;
  double x;
  double *lval;
  int *lidx;
  int j;
  int i;
  int ll;
  undefined8 in_stack_ffffffffffffffc8;
  long lVar6;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  
  dVar4 = 1.0 / *(double *)(in_RDX + (long)in_ESI * 8);
  local_28 = makeLvec((CLUFactor<double> *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8
                     );
  pdVar3 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x25b1c4);
  lVar6 = *(long *)(in_RDI + 0x1e);
  iVar2 = in_R8D + -1;
  while (iVar1 = *(int *)(in_RCX + (long)iVar2 * 4), iVar1 != in_ESI) {
    *(int *)(lVar6 + (long)local_28 * 4) = iVar1;
    pdVar3[local_28] = dVar4 * *(double *)(in_RDX + (long)iVar1 * 8);
    local_28 = local_28 + 1;
    iVar2 = iVar2 + -1;
  }
  *(int *)(lVar6 + (long)local_28 * 4) = in_ESI;
  pdVar3[local_28] = 1.0 - dVar4;
  while( true ) {
    local_28 = local_28 + 1;
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) break;
    iVar1 = *(int *)(in_RCX + (long)iVar2 * 4);
    *(int *)(lVar6 + (long)local_28 * 4) = iVar1;
    a = dVar4 * *(double *)(in_RDX + (long)iVar1 * 8);
    pdVar3[local_28] = a;
    RVar5 = spxAbs<double>(a);
    if (*(double *)(in_RDI + 6) <= RVar5 && RVar5 != *(double *)(in_RDI + 6)) {
      RVar5 = spxAbs<double>(a);
      *(Real *)(in_RDI + 6) = RVar5;
    }
  }
  *in_RDI = 0;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}